

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O0

void PlayingState::CmdAdvancedPrompt
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  bool bVar1;
  element_type *peVar2;
  ostream *poVar3;
  element_type *peVar4;
  string local_208 [32];
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  undefined1 local_30 [8];
  shared_ptr<Player> player;
  shared_ptr<GameData> *game_data_local;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  
  player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)game_data;
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  Connection::GetPlayer((Connection *)local_30);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"Advanced Prompt ");
  bVar1 = std::operator==(input,"off");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )connection);
    Connection::AdvancedPrompt(peVar2,false);
    poVar3 = std::operator<<(local_1a8,"off");
    std::operator<<(poVar3,(string *)Format::NL_abi_cxx11_);
    peVar4 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    std::__cxx11::stringstream::str();
    (**(peVar4->super_Entity)._vptr_Entity)(peVar4,local_1e8);
    std::__cxx11::string::~string(local_1e8);
  }
  else {
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )connection);
    Connection::AdvancedPrompt(peVar2,true);
    poVar3 = std::operator<<(local_1a8,"on");
    std::operator<<(poVar3,(string *)Format::NL_abi_cxx11_);
    peVar4 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    std::__cxx11::stringstream::str();
    (**(peVar4->super_Entity)._vptr_Entity)(peVar4,local_208);
    std::__cxx11::string::~string(local_208);
  }
  peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  bVar1 = std::operator!=(input,"off");
  Connection::AdvancedPrompt(peVar2,bVar1);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::shared_ptr<Player>::~shared_ptr((shared_ptr<Player> *)local_30);
  return;
}

Assistant:

void PlayingState::CmdAdvancedPrompt(const std::string &input, std::shared_ptr<Connection> connection,
                                    std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    std::stringstream ss;
    ss << "Advanced Prompt ";
    if(input == "off") {
        connection->AdvancedPrompt(false);
        ss << "off" << Format::NL;
        player->Send(ss.str());
    } else {
        connection->AdvancedPrompt(true);
        ss << "on" << Format::NL;
        player->Send(ss.str());
    }
    connection->AdvancedPrompt(input != "off");
}